

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

double Abc_GraphCountPaths(Vec_Wec_t *vNodes,Vec_Int_t *vEdges)

{
  int iVar1;
  double **pCache_00;
  Vec_Int_t *p;
  double *pdVar2;
  double dVar3;
  double Value;
  Vec_Int_t *vLevel;
  double **pCache;
  int pBuffer [1000];
  int local_20;
  int local_1c;
  int k;
  int i;
  Vec_Int_t *vEdges_local;
  Vec_Wec_t *vNodes_local;
  
  memset(&pCache,0,4000);
  iVar1 = Vec_WecSize(vNodes);
  pCache_00 = (double **)malloc((long)iVar1 << 3);
  for (local_1c = 0; iVar1 = Vec_WecSize(vNodes), local_1c < iVar1; local_1c = local_1c + 1) {
    p = Vec_WecEntry(vNodes,local_1c);
    iVar1 = Vec_IntSize(p);
    pdVar2 = (double *)malloc((long)iVar1 << 3);
    pCache_00[local_1c] = pdVar2;
    for (local_20 = 0; iVar1 = Vec_IntSize(p), local_20 < iVar1; local_20 = local_20 + 1) {
      pCache_00[local_1c][local_20] = -1.0;
    }
  }
  dVar3 = Abc_GraphCountPaths_rec(0,0,vNodes,pCache_00,(int *)&pCache,vEdges);
  for (local_1c = 0; iVar1 = Vec_WecSize(vNodes), local_1c < iVar1; local_1c = local_1c + 1) {
    if (pCache_00[local_1c] != (double *)0x0) {
      free(pCache_00[local_1c]);
      pCache_00[local_1c] = (double *)0x0;
    }
  }
  if (pCache_00 != (double **)0x0) {
    free(pCache_00);
  }
  return dVar3;
}

Assistant:

double Abc_GraphCountPaths( Vec_Wec_t * vNodes, Vec_Int_t * vEdges )
{
    int i, k, pBuffer[1000] = {0};
    double ** pCache = ABC_ALLOC( double *, Vec_WecSize(vNodes) );
    Vec_Int_t * vLevel;   double Value;
    Vec_WecForEachLevel( vNodes, vLevel, i )
    {
        pCache[i] = ABC_ALLOC( double, Vec_IntSize(vLevel) );
        for ( k = 0; k < Vec_IntSize(vLevel); k++ )
            pCache[i][k] = -1.0;
    }
    Value = Abc_GraphCountPaths_rec( 0, 0, vNodes, pCache, pBuffer, vEdges );
    for ( i = 0; i < Vec_WecSize(vNodes); i++ )
        ABC_FREE( pCache[i] );
    ABC_FREE( pCache );
    return Value;
}